

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

void __thiscall icu_63::SimpleTimeZone::decodeStartRule(SimpleTimeZone *this,UErrorCode *status)

{
  UBool UVar1;
  bool bVar2;
  UErrorCode *status_local;
  SimpleTimeZone *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    bVar2 = false;
    if (this->startDay != '\0') {
      bVar2 = this->endDay != '\0';
    }
    this->useDaylight = bVar2;
    if ((this->useDaylight != '\0') && (this->dstSavings == 0)) {
      this->dstSavings = 3600000;
    }
    if (this->startDay != '\0') {
      if ((this->startMonth < '\0') || ('\v' < this->startMonth)) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else if ((((this->startTime < 0) || (86400000 < this->startTime)) ||
               ((int)this->startTimeMode < 0)) || (2 < (int)this->startTimeMode)) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        if (this->startDayOfWeek == '\0') {
          this->startMode = DOM_MODE;
        }
        else {
          if (this->startDayOfWeek < '\x01') {
            this->startDayOfWeek = -this->startDayOfWeek;
            if (this->startDay < '\x01') {
              this->startDay = -this->startDay;
              this->startMode = DOW_LE_DOM_MODE;
            }
            else {
              this->startMode = DOW_GE_DOM_MODE;
            }
          }
          else {
            this->startMode = DOW_IN_MONTH_MODE;
          }
          if ('\a' < this->startDayOfWeek) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return;
          }
        }
        if (this->startMode == DOW_IN_MONTH_MODE) {
          if ((this->startDay < -5) || ('\x05' < this->startDay)) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
          }
        }
        else if ((this->startDay < '\x01') ||
                ((char)STATICMONTHLENGTH[this->startMonth] < this->startDay)) {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
        }
      }
    }
  }
  return;
}

Assistant:

void 
SimpleTimeZone::decodeStartRule(UErrorCode& status) 
{
    if(U_FAILURE(status)) return;

    useDaylight = (UBool)((startDay != 0) && (endDay != 0) ? TRUE : FALSE);
    if (useDaylight && dstSavings == 0) {
        dstSavings = U_MILLIS_PER_HOUR;
    }
    if (startDay != 0) {
        if (startMonth < UCAL_JANUARY || startMonth > UCAL_DECEMBER) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        if (startTime < 0 || startTime > U_MILLIS_PER_DAY ||
            startTimeMode < WALL_TIME || startTimeMode > UTC_TIME) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        if (startDayOfWeek == 0) {
            startMode = DOM_MODE;
        } else {
            if (startDayOfWeek > 0) {
                startMode = DOW_IN_MONTH_MODE;
            } else {
                startDayOfWeek = (int8_t)-startDayOfWeek;
                if (startDay > 0) {
                    startMode = DOW_GE_DOM_MODE;
                } else {
                    startDay = (int8_t)-startDay;
                    startMode = DOW_LE_DOM_MODE;
                }
            }
            if (startDayOfWeek > UCAL_SATURDAY) {
                status = U_ILLEGAL_ARGUMENT_ERROR;
                return;
            }
        }
        if (startMode == DOW_IN_MONTH_MODE) {
            if (startDay < -5 || startDay > 5) {
                status = U_ILLEGAL_ARGUMENT_ERROR;
                return;
            }
        } else if (startDay<1 || startDay > STATICMONTHLENGTH[startMonth]) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
    }
}